

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c++
# Opt level: O0

void kj::_::inlineRequireFailure
               (char *file,int line,char *expectation,char *macroArgs,char *message)

{
  Fault local_50;
  Fault f_1;
  Fault local_38;
  Fault f;
  char *message_local;
  char *macroArgs_local;
  char *expectation_local;
  int line_local;
  char *file_local;
  
  f.exception = (Exception *)message;
  if (message == (char *)0x0) {
    Debug::Fault::Fault(&local_38,file,line,FAILED,expectation,macroArgs);
    Debug::Fault::fatal(&local_38);
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const*&>
            (&local_50,file,line,FAILED,expectation,macroArgs,(char **)&f);
  Debug::Fault::fatal(&local_50);
}

Assistant:

void inlineRequireFailure(const char* file, int line, const char* expectation,
                          const char* macroArgs, const char* message) {
  if (message == nullptr) {
    Debug::Fault f(file, line, kj::Exception::Type::FAILED, expectation, macroArgs);
    f.fatal();
  } else {
    Debug::Fault f(file, line, kj::Exception::Type::FAILED, expectation, macroArgs, message);
    f.fatal();
  }
}